

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_fits.c
# Opt level: O0

void sfts_head2str(sfts_t *f,char ***keys,char ***vals,char ***coms)

{
  int iVar1;
  undefined8 uVar2;
  size_t sVar3;
  char *errtext;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  char *_base;
  char _msg [31];
  int len;
  int regular;
  char *key;
  int i;
  char com [81];
  char val [81];
  char skey [81];
  char *longstr;
  char *str;
  GArray *ac;
  GArray *av;
  GArray *ak;
  int *s;
  int nkeys;
  int *in_stack_fffffffffffffe18;
  int *in_stack_fffffffffffffe20;
  fitsfile *in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe30;
  bool local_1c1;
  undefined1 local_1b8 [30];
  undefined1 local_19a;
  int local_190;
  uint local_18c;
  char *local_188;
  int local_17c;
  undefined1 local_178 [88];
  int *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff04;
  fitsfile *in_stack_ffffffffffffff08;
  int *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  char **in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  fitsfile *in_stack_ffffffffffffff48;
  char *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  long local_30;
  int local_24;
  undefined8 *local_20;
  undefined8 *local_18;
  undefined8 *local_10;
  long local_8;
  
  local_30 = in_RDI + 0x20;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  ffghsp(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
         (int *)0x10f2af);
  local_38 = g_array_sized_new(1,0,8,local_24);
  local_40 = g_array_sized_new(1,0,8,local_24);
  local_48 = g_array_sized_new(1,0,8,local_24);
  for (local_17c = 1; iVar1 = (int)((ulong)in_stack_fffffffffffffe30 >> 0x20), local_17c <= local_24
      ; local_17c = local_17c + 1) {
    ffgkyn(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_fffffffffffffef8,
           in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    uVar2 = g_strchug(&stack0xffffffffffffff48);
    local_188 = (char *)g_strchomp(uVar2);
    iVar1 = strcmp("CONTINUE",local_188);
    if (iVar1 != 0) {
      if (*local_188 == '\0') {
        local_188 = "COMMENT";
      }
      iVar1 = strcmp("HISTORY",local_188);
      local_1c1 = false;
      if (iVar1 != 0) {
        iVar1 = strcmp("COMMENT",local_188);
        local_1c1 = iVar1 != 0;
      }
      local_18c = (uint)local_1c1;
      if (local_18c != 0) {
        ffgkls(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        sVar3 = strlen(local_58);
        local_190 = (int)sVar3;
        if ((0x44 < local_190) && (local_58[local_190 + -1] == '&')) {
          local_58[local_190 + -1] = '\0';
        }
      }
      local_50 = g_strdup(local_188);
      g_array_append_vals(local_38,&local_50,1);
      in_stack_fffffffffffffe30 = local_58;
      if (local_18c == 0) {
        in_stack_fffffffffffffe30 = &stack0xfffffffffffffee8;
      }
      local_50 = g_strdup(in_stack_fffffffffffffe30);
      g_array_append_vals(local_40,&local_50,1);
      local_50 = g_strdup(local_178);
      g_array_append_vals(local_48,&local_50,1);
      if (local_18c != 0) {
        fffree(in_stack_fffffffffffffe18,(int *)0x10f52c);
      }
    }
  }
  if ((local_8 != 0) && (*(int *)(local_8 + 0x20) != 0)) {
    if (*(long *)(local_8 + 0x10) == 0) {
      errtext = (char *)g_strdup("memory");
    }
    else {
      errtext = (char *)g_path_get_basename(*(undefined8 *)(local_8 + 0x10));
    }
    ffgerr(iVar1,errtext);
    local_19a = 0;
    _p2sc_msg("sfts_head2str",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
              ,0x284,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x11f8,"FITS: %s: %s",
              local_1b8,errtext);
    exit(1);
  }
  uVar2 = g_array_free(local_38,0);
  *local_10 = uVar2;
  uVar2 = g_array_free(local_40,0);
  *local_18 = uVar2;
  uVar2 = g_array_free(local_48,0);
  *local_20 = uVar2;
  return;
}

Assistant:

void sfts_head2str(sfts_t *f, char ***keys, char ***vals, char ***coms) {
    int nkeys, *s = &f->stat;
    fits_get_hdrspace(f->fts, &nkeys, NULL, s);

    GArray *ak = g_array_sized_new(TRUE, FALSE, sizeof **keys, nkeys);
    GArray *av = g_array_sized_new(TRUE, FALSE, sizeof **vals, nkeys);
    GArray *ac = g_array_sized_new(TRUE, FALSE, sizeof **coms, nkeys);

    char *str, *longstr;
    char skey[SKEY_LEN], val[SKEY_LEN], com[SKEY_LEN];
    for (int i = 1; i <= nkeys; ++i) {
        fits_read_keyn(f->fts, i, skey, val, com, s);

        char *key = g_strstrip(skey);
        if (!strcmp("CONTINUE", key))
            continue;
        if (key[0] == 0)
            key = "COMMENT";

        int regular = strcmp("HISTORY", key) && strcmp("COMMENT", key);
        if (regular) {
            fits_read_key_longstr(f->fts, key, &longstr, com, s);
            // long strings may end in &, e.g., EUI FILE_RAW
            int len = strlen(longstr);
            if (len > 68 && longstr[len - 1] == '&')
                longstr[len - 1] = 0;
        }

        str = g_strdup(key);
        g_array_append_val(ak, str);
        str = g_strdup(regular ? longstr : val);
        g_array_append_val(av, str);
        str = g_strdup(com);
        g_array_append_val(ac, str);

        if (regular)
            fits_free_memory(longstr, s);
    }
    CHK_FTS(f);

    *keys = (char **) g_array_free(ak, FALSE);
    *vals = (char **) g_array_free(av, FALSE);
    *coms = (char **) g_array_free(ac, FALSE);
}